

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__hdr_test_core(stbi__context *s,char *signature)

{
  char cVar1;
  uint uVar2;
  byte *pbVar3;
  char *pcVar4;
  
  if (*signature != '\0') {
    pcVar4 = signature + 1;
    do {
      pbVar3 = s->img_buffer;
      if (pbVar3 < s->img_buffer_end) {
LAB_001185a9:
        s->img_buffer = pbVar3 + 1;
        uVar2 = (uint)*pbVar3;
      }
      else {
        if (s->read_from_callbacks != 0) {
          stbi__refill_buffer(s);
          pbVar3 = s->img_buffer;
          goto LAB_001185a9;
        }
        uVar2 = 0;
      }
      if (uVar2 != (int)pcVar4[-1]) {
        return 0;
      }
      cVar1 = *pcVar4;
      pcVar4 = pcVar4 + 1;
    } while (cVar1 != '\0');
  }
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  return 1;
}

Assistant:

static int stbi__hdr_test_core(stbi__context *s, const char *signature)
{
   int i;
   for (i=0; signature[i]; ++i)
      if (stbi__get8(s) != signature[i])
          return 0;
   stbi__rewind(s);
   return 1;
}